

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::Matcher<mp::NumericConstant>::Matcher
          (Matcher<mp::NumericConstant> *this,NumericConstant value)

{
  linked_ptr<const_testing::MatcherInterface<mp::NumericConstant>_> local_30;
  
  (this->super_MatcherBase<mp::NumericConstant>).impl_.value_ =
       (MatcherInterface<mp::NumericConstant> *)0x0;
  (this->super_MatcherBase<mp::NumericConstant>).impl_.link_.next_ =
       &(this->super_MatcherBase<mp::NumericConstant>).impl_.link_;
  (this->super_MatcherBase<mp::NumericConstant>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001e11d0;
  local_30.value_ = (MatcherInterface<mp::NumericConstant> *)operator_new(0x10);
  ((local_30.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001e4270;
  local_30.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)
       value.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_;
  local_30.link_.next_ = &local_30.link_;
  internal::linked_ptr<const_testing::MatcherInterface<mp::NumericConstant>_>::operator=
            (&(this->super_MatcherBase<mp::NumericConstant>).impl_,&local_30);
  internal::linked_ptr<const_testing::MatcherInterface<mp::NumericConstant>_>::~linked_ptr
            (&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }